

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lipm-dcm-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::LipmDcmEstimator::LipmDcmEstimator
          (LipmDcmEstimator *this,double dt,double omega_0,double biasDriftStd,
          double dcmMeasureErrorStd,double zmpMeasureErrorStd,Vector2 *biasLimit,Vector2 *initZMP,
          Vector2 *initDcm,Vector2 *initBias,Vector2 *initDcmUncertainty,
          Vector2 *initBiasUncertainty)

{
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar1;
  Pmatrix local_260;
  Matrix2 local_248;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_228 [16];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_218 [16];
  Matrix2 local_208;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_1e8;
  undefined1 local_1c8 [8];
  Matrix4 P;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_138;
  undefined1 local_118 [8];
  Vector4 x;
  Cmatrix local_e0;
  Matrix2 local_c8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_a6 [3];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>_>
  local_a3 [3];
  CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> local_a0;
  CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
  local_7f [5];
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_70 [16];
  Vector2 *local_60;
  Vector2 *initDcmUncertainty_local;
  Vector2 *initBias_local;
  Vector2 *initDcm_local;
  Vector2 *initZMP_local;
  Vector2 *biasLimit_local;
  double zmpMeasureErrorStd_local;
  double dcmMeasureErrorStd_local;
  double biasDriftStd_local;
  double omega_0_local;
  double dt_local;
  LipmDcmEstimator *this_local;
  
  this->omega0_ = omega_0;
  local_60 = initDcmUncertainty;
  initDcmUncertainty_local = initBias;
  initBias_local = initDcm;
  initDcm_local = initZMP;
  initZMP_local = biasLimit;
  biasLimit_local = (Vector2 *)zmpMeasureErrorStd;
  zmpMeasureErrorStd_local = dcmMeasureErrorStd;
  dcmMeasureErrorStd_local = biasDriftStd;
  biasDriftStd_local = omega_0;
  omega_0_local = dt;
  dt_local = (double)this;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::Zero();
  Eigen::Matrix<double,2,1,0,2,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,2,1,0,2,1>>>
            ((Matrix<double,2,1,0,2,1> *)&this->gamma_,local_70);
  this->kappa_ = 1.0;
  this->dt_ = omega_0_local;
  this->biasDriftStd_ = dcmMeasureErrorStd_local;
  this->zmpErrorStd_ = (double)biasLimit_local;
  this->needUpdateMatrices_ = true;
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->previousZmp_,initDcm_local);
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix(&this->biasLimit_,initZMP_local);
  LinearKalmanFilter::LinearKalmanFilter(&this->filter_,4,2,4);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix(&this->A_);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix(&this->B_);
  Eigen::Matrix<double,_2,_4,_0,_2,_4>::Matrix(&this->C_);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix(&this->R_);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix(&this->Q_);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  Eigen::Matrix<double,2,2,0,2,2>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,2,2,0,2,2>>>
            ((Matrix<double,2,2,0,2,2> *)&this->previousOrientation_,local_7f);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&this->A_);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&this->B_);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&this->Q_);
  updateMatricesABQ_(this);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  Eigen::DenseBase<Eigen::Matrix<double,2,4,0,2,4>>::operator<<
            (&local_a0,(DenseBase<Eigen::Matrix<double,2,4,0,2,4>> *)&this->C_,local_a3);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Identity();
  Eigen::CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,2,4,0,2,4>> *)&local_a0,local_a6);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::~CommaInitializer(&local_a0);
  dblToSqDiag_(&local_c8,&zmpMeasureErrorStd_local);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::operator=(&this->R_,&local_c8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,4,0,2,4>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_e0,
             (EigenBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)&this->C_);
  KalmanFilterBase::setC(&(this->filter_).super_KalmanFilterBase,&local_e0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_e0);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,2,0,2,2>>
            ((Matrix<double,_1,_1,0,_1,_1> *)
             (x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
             + 3),(EigenBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&this->R_);
  KalmanFilterBase::setMeasurementCovariance
            (&(this->filter_).super_KalmanFilterBase,
             (Rmatrix *)
             (x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
             + 3));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)
             (x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
             + 3));
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)local_118);
  Eigen::DenseBase<Eigen::Matrix<double,4,1,0,4,1>>::operator<<
            (&local_138,(DenseBase<Eigen::Matrix<double,4,1,0,4,1>> *)local_118,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initBias_local);
  Eigen::CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,4,1,0,4,1>> *)&local_138,
             (DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initDcmUncertainty_local);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer(&local_138);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,4,1,0,4,1>>
            ((Matrix<double,_1,1,0,_1,1> *)
             (P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),(EigenBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_118);
  ZeroDelayObserver::setState
            ((ZeroDelayObserver *)&this->filter_,
             (StateVector *)
             (P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             (P.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_1c8);
  Vec2ToSqDiag_(&local_208,local_60);
  Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::operator<<
            (&local_1e8,(DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)local_1c8,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_208);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Zero();
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_1e8,local_218);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::Zero();
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar1,local_228);
  Vec2ToSqDiag_(&local_248,initBiasUncertainty);
  Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)pCVar1,
             (DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_248);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer(&local_1e8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,4,4,0,4,4>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_260,
             (EigenBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_1c8);
  KalmanFilterBase::setStateCovariance(&(this->filter_).super_KalmanFilterBase,&local_260);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_260);
  return;
}

Assistant:

LipmDcmEstimator::LipmDcmEstimator(double dt,
                                   double omega_0,
                                   double biasDriftStd,
                                   double dcmMeasureErrorStd,
                                   double zmpMeasureErrorStd,
                                   const Vector2 & biasLimit,
                                   const Vector2 & initZMP,
                                   const Vector2 & initDcm,
                                   const Vector2 & initBias,
                                   const Vector2 & initDcmUncertainty,
                                   const Vector2 & initBiasUncertainty)
: omega0_(omega_0), dt_(dt), biasDriftStd_(biasDriftStd), zmpErrorStd_(zmpMeasureErrorStd), previousZmp_(initZMP),
  biasLimit_(biasLimit), filter_(4, 2, 4), previousOrientation_(Matrix2::Identity())
{
  A_.setIdentity();
  B_.setZero();
  Q_.setIdentity();
  updateMatricesABQ_();
  C_ << Matrix2::Identity(), Matrix2::Identity();
  R_ = dblToSqDiag_(dcmMeasureErrorStd);
  filter_.setC(C_);
  filter_.setMeasurementCovariance(R_);
  Vector4 x;
  x << initDcm, initBias;
  filter_.setState(x, 0);
  Matrix4 P;
  // clang-format off
  P<< Vec2ToSqDiag_(initDcmUncertainty),  Matrix2::Zero(),
      Matrix2::Zero(),                   Vec2ToSqDiag_(initBiasUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}